

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausBmcClauses(Clu_Man_t *p)

{
  int iVar1;
  int *piVar2;
  sat_solver *s;
  int *piVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  Cnf_Dat_t *pCVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int local_4c;
  
  iVar5 = p->nPref;
  if (iVar5 == 0) {
    pCVar8 = p->pCnf;
    pVVar7 = p->vLits;
  }
  else {
    pCVar8 = p->pCnf;
    pVVar7 = p->vLits;
    if (0 < pVVar7->nSize) {
      iVar1 = pCVar8->nVars;
      piVar2 = pVVar7->pArray;
      lVar12 = 0;
      do {
        piVar2[lVar12] = piVar2[lVar12] + iVar5 * iVar1 * 2;
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar7->nSize);
    }
  }
  iVar1 = pCVar8->nVars * 2;
  iVar5 = p->nFrames;
  if (iVar5 < 1) {
    iVar11 = pVVar7->nSize;
    local_4c = 0;
  }
  else {
    piVar2 = pVVar7->pArray;
    pVVar9 = p->vClauses;
    iVar13 = 0;
    local_4c = 0;
    do {
      if (0 < pVVar9->nSize) {
        lVar12 = 0;
        iVar5 = 0;
        do {
          if (p->vCosts->nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar11 = pVVar9->pArray[lVar12];
          iVar4 = p->vCosts->pArray[lVar12];
          if (iVar4 != -1) {
            if (iVar4 < 1) {
              __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                            ,0x39f,"int Fra_ClausBmcClauses(Clu_Man_t *)");
            }
            if (p->nLutSize < iVar11 - iVar5) {
              __assert_fail("End - Beg <= p->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                            ,0x3a0,"int Fra_ClausBmcClauses(Clu_Man_t *)");
            }
            lVar14 = (long)iVar11;
            lVar10 = (long)iVar5;
            lVar6 = lVar10;
            if (iVar5 < iVar11) {
              do {
                *(byte *)(piVar2 + lVar6) = *(byte *)(piVar2 + lVar6) ^ 1;
                lVar6 = lVar6 + 1;
              } while (lVar14 != lVar6);
              iVar4 = sat_solver_solve(p->pSatBmc,piVar2 + lVar10,piVar2 + lVar14,(long)p->nBTLimit,
                                       0,0,0);
              if (iVar5 < iVar11) {
                do {
                  *(byte *)(piVar2 + lVar10) = *(byte *)(piVar2 + lVar10) ^ 1;
                  lVar10 = lVar10 + 1;
                } while (lVar14 != lVar10);
              }
            }
            else {
              iVar4 = sat_solver_solve(p->pSatBmc,piVar2 + lVar10,piVar2 + lVar14,(long)p->nBTLimit,
                                       0,0,0);
            }
            if (iVar4 == -1) {
              s = p->pSatBmc;
              if (s->qtail != s->qhead) {
                iVar5 = sat_solver_simplify(s);
                if (iVar5 == 0) {
                  __assert_fail("RetValue != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                                ,0x3bf,"int Fra_ClausBmcClauses(Clu_Man_t *)");
                }
                if (p->pSatBmc->qtail != p->pSatBmc->qhead) {
                  __assert_fail("p->pSatBmc->qtail == p->pSatBmc->qhead",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                                ,0x3c0,"int Fra_ClausBmcClauses(Clu_Man_t *)");
                }
              }
            }
            else {
              if (p->vCosts->nSize <= lVar12) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              p->vCosts->pArray[lVar12] = -1;
              local_4c = local_4c + 1;
            }
          }
          lVar12 = lVar12 + 1;
          pVVar9 = p->vClauses;
          iVar5 = iVar11;
        } while (lVar12 < pVVar9->nSize);
        pVVar7 = p->vLits;
      }
      iVar11 = pVVar7->nSize;
      if (0 < iVar11) {
        piVar3 = pVVar7->pArray;
        lVar12 = 0;
        do {
          piVar3[lVar12] = piVar3[lVar12] + iVar1;
          lVar12 = lVar12 + 1;
          iVar11 = pVVar7->nSize;
        } while (lVar12 < iVar11);
      }
      iVar13 = iVar13 + 1;
      iVar5 = p->nFrames;
    } while (iVar13 < iVar5);
  }
  if (0 < iVar11) {
    iVar11 = p->nPref;
    piVar2 = pVVar7->pArray;
    lVar12 = 0;
    do {
      piVar2[lVar12] = piVar2[lVar12] - (iVar5 + iVar11) * iVar1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
  }
  return local_4c;
}

Assistant:

int Fra_ClausBmcClauses( Clu_Man_t * p )
{
    int * pStart, nLitsTot, RetValue, Beg, End, Counter, i, k, f;
/*
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        printf( "%d ", p->vLits->pArray[i] );
    printf( "\n" );
*/
    // add the clauses
    Counter = 0;
    // skip through the prefix variables
    if ( p->nPref )
    {
        nLitsTot = p->nPref * 2 * p->pCnf->nVars;
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }
    // go through the timeframes
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLits);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            if ( Vec_IntEntry( p->vCosts, i ) == -1 )
            {
                Beg = End;
                continue;
            }
            assert( Vec_IntEntry( p->vCosts, i ) > 0 );
            assert( End - Beg <= p->nLutSize );

            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            RetValue = sat_solver_solve( p->pSatBmc, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );

            if ( RetValue != l_False )
            {
                Beg = End;
                Vec_IntWriteEntry( p->vCosts, i, -1 );
                Counter++;
                continue;
            }
/*
            // add the clause
            RetValue = sat_solver_addclause( p->pSatBmc, pStart + Beg, pStart + End );
    //        assert( RetValue == 1 );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding BMC clauses.\n" );
                return -1;
            }
*/
            Beg = End;

            // simplify the solver
            if ( p->pSatBmc->qtail != p->pSatBmc->qhead )
            {
                RetValue = sat_solver_simplify(p->pSatBmc);
                assert( RetValue != 0 );
                assert( p->pSatBmc->qtail == p->pSatBmc->qhead );
            }
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }

    // return clauses back to normal
    nLitsTot = (p->nPref + p->nFrames) * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        p->vLits->pArray[i] -= nLitsTot;
/*
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        printf( "%d ", p->vLits->pArray[i] );
    printf( "\n" );
*/
    return Counter;
}